

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::exceed_texture_image_units_limit
               (NegativeTestContext *ctx)

{
  ostringstream *poVar1;
  RenderContext *renderCtx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *log;
  undefined4 uVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int limit;
  ShaderProgram program;
  ostringstream shaderDecl;
  ostringstream shaderBody;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  uint local_598;
  value_type local_590;
  undefined1 local_570 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560 [3];
  ios_base local_4f8 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_4e0;
  undefined1 local_4c0 [208];
  ShaderProgram local_3f0;
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_570._0_8_ = local_570._0_8_ & 0xffffffff00000000;
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x91bc,(GLint *)local_570);
  uVar2 = local_570._0_4_;
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"layout(binding = 0) ",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"uniform highp sampler2D u_sampler[",0x22);
  iVar5 = uVar2 + 2;
  poVar3 = (ostream *)std::ostream::operator<<(local_320,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"layout(binding = 0) buffer Output {\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    vec4 values[ ",0x11);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ];\n",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"} sb_out;\n",10);
  if (0 < iVar5) {
    iVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"   sb_out.values[",0x11);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] = texture(u_sampler[",0x16);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"], vec2(1.0f));\n",0x10);
      iVar6 = iVar6 + 1;
    } while (iVar5 != iVar6);
  }
  renderCtx = ctx->m_renderCtx;
  local_4c0[0x10] = 0;
  local_4c0._17_8_ = 0;
  local_4c0._0_8_ = (pointer)0x0;
  local_4c0[8] = 0;
  local_4c0._9_7_ = 0;
  memset(local_570,0,0xac);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateComputeShader(&local_5f8,ctx,&local_5b8,&local_5d8);
  local_598 = 5;
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_590,local_5f8._M_dataplus._M_p,
             local_5f8._M_dataplus._M_p + local_5f8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_570 + (ulong)local_598 * 0x18),&local_590);
  glu::ShaderProgram::ShaderProgram(&local_3f0,renderCtx,(ProgramSources *)local_570);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4c0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_4e0);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_570 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  log = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (ctx->super_CallLogWrapper).m_log;
  poVar1 = (ostringstream *)(local_570 + 8);
  local_570._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Possible link error is generated if compute shader exceeds GL_MAX_COMPUTE_TEXTURE_IMAGE_UNITS."
             ,0x5e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_570,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_4f8);
  glu::operator<<((TestLog *)log,&local_3f0);
  if (local_3f0.m_program.m_info.linkOk == true) {
    poVar1 = (ostringstream *)(local_570 + 8);
    local_570._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Quality Warning: program was not expected to link.",0x32);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_570,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_4f8);
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_3f0.m_program.m_program);
    NegativeTestContext::expectError(ctx,0);
    local_570._0_8_ = local_560;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_570,
               "GL_INVALID_OPERATION error is generated if the sum of the number of active samplers for each active program exceeds the maximum number of texture image units allowed"
               ,"");
    NegativeTestContext::beginSection(ctx,(string *)local_570);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_570._0_8_ !=
        local_560) {
      operator_delete((void *)local_570._0_8_,(ulong)(local_560[0]._M_dataplus._M_p + 1));
    }
    glu::CallLogWrapper::glDispatchCompute(&ctx->super_CallLogWrapper,1,1,1);
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
  }
  glu::ShaderProgram::~ShaderProgram(&local_3f0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  return;
}

Assistant:

void exceed_texture_image_units_limit (NegativeTestContext& ctx)
{
	const int			limit			= getResourceLimit(ctx, GL_MAX_COMPUTE_TEXTURE_IMAGE_UNITS) + 1;
	std::ostringstream	shaderDecl;
	std::ostringstream	shaderBody;

	shaderDecl	<< "layout(binding = 0) "
				<< "uniform highp sampler2D u_sampler[" << limit + 1 << "];\n"
				<< "\n"
				<< "layout(binding = 0) buffer Output {\n"
				<< "    vec4 values[ " << limit + 1 << " ];\n"
				<< "} sb_out;\n";

	for (int i = 0; i < limit + 1; ++i)
		shaderBody	<< "   sb_out.values[" << i << "] = texture(u_sampler[" << i << "], vec2(1.0f));\n";

	glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources()
			<< glu::ComputeSource(generateComputeShader(ctx, shaderDecl.str(), shaderBody.str())));

	tcu::TestLog& log = ctx.getLog();
	log << tcu::TestLog::Message << "Possible link error is generated if compute shader exceeds GL_MAX_COMPUTE_TEXTURE_IMAGE_UNITS." << tcu::TestLog::EndMessage;
	log << program;

	if (program.getProgramInfo().linkOk)
	{
		log << tcu::TestLog::Message << "Quality Warning: program was not expected to link." << tcu::TestLog::EndMessage;
		ctx.glUseProgram(program.getProgram());
		ctx.expectError(GL_NO_ERROR);

		ctx.beginSection("GL_INVALID_OPERATION error is generated if the sum of the number of active samplers for each active program exceeds the maximum number of texture image units allowed");
		ctx.glDispatchCompute(1, 1, 1);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.endSection();
	}
}